

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_add_local_cell(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT *nodes)

{
  bool local_41;
  REF_INT local_3c;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT new_cell;
  REF_INT node;
  REF_BOOL has_local;
  REF_NODE ref_node;
  REF_INT *nodes_local;
  REF_CELL ref_cell_local;
  REF_SUBDIV ref_subdiv_local;
  
  _node = ref_subdiv->grid->node;
  new_cell = 0;
  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_cell->node_per;
      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
    local_41 = true;
    if (new_cell == 0) {
      local_41 = ref_subdiv->grid->mpi->id == _node->part[nodes[ref_private_macro_code_rss]];
    }
    new_cell = (REF_INT)local_41;
  }
  if ((new_cell == 0) ||
     (ref_node = (REF_NODE)nodes, nodes_local = (REF_INT *)ref_cell,
     ref_cell_local = (REF_CELL)ref_subdiv,
     ref_subdiv_local._4_4_ = ref_cell_add(ref_cell,nodes,&local_3c), ref_subdiv_local._4_4_ == 0))
  {
    ref_subdiv_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x402,
           "ref_subdiv_add_local_cell",(ulong)ref_subdiv_local._4_4_,"add");
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_add_local_cell(REF_SUBDIV ref_subdiv,
                                                    REF_CELL ref_cell,
                                                    REF_INT *nodes) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_BOOL has_local;
  REF_INT node, new_cell;

  has_local = REF_FALSE;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    has_local = has_local || (ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)) ==
                              ref_node_part(ref_node, nodes[node]));

  if (has_local) RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add");

  return REF_SUCCESS;
}